

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O3

void __thiscall FunctionTableTerm::PrintTerm(FunctionTableTerm *this)

{
  pointer p_Var1;
  pointer p_Var2;
  
  fwrite("--------------------------------------\n",0x27,1,(FILE *)fp_symbol);
  fprintf((FILE *)fp_symbol,
          "function\nname: %s\ntop label: %s\nbottom label: %s\nargument space: %d\nreturn value space: %d\nspace length: %d\nargument type:\n"
          ,(this->m_func_name)._M_dataplus._M_p,(this->m_top_label)._M_dataplus._M_p,
          (this->m_bottom_label)._M_dataplus._M_p,(ulong)(uint)this->m_argument_space_length,
          (ulong)(uint)this->m_return_value_space_length,(ulong)(uint)this->m_space_length);
  p_Var1 = (this->m_argument_type).super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (p_Var2 = (this->m_argument_type).
                super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
                super__Vector_impl_data._M_start; p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    fprintf((FILE *)fp_symbol,"\t%s\n",symbol_type_string[*p_Var2]);
  }
  return;
}

Assistant:

void FunctionTableTerm::PrintTerm() const {
    fprintf(fp_symbol, "--------------------------------------\n");
    fprintf(fp_symbol, "function\nname: %s\ntop label: %s\nbottom label: %s\nargument space: %d\nreturn value space: %d\nspace length: %d\nargument type:\n",
    m_func_name.c_str(), m_top_label.c_str(), m_bottom_label.c_str(), m_argument_space_length, m_return_value_space_length, m_space_length);
    for (SymbolType tmp : m_argument_type) {
        fprintf(fp_symbol, "\t%s\n", symbol_type_string[tmp]);
    }
}